

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O0

void P_InitParticles(void)

{
  undefined1 auVar1 [16];
  int iVar2;
  char *__nptr;
  ulong uVar3;
  ulong uVar4;
  particle_t *ppVar5;
  particle_t *local_48;
  int local_14;
  int num;
  char *i;
  
  __nptr = DArgs::CheckValue(Args,"-numparticles");
  if (__nptr == (char *)0x0) {
    local_14 = FIntCVar::operator_cast_to_int(&r_maxparticles);
  }
  else {
    local_14 = atoi(__nptr);
  }
  iVar2 = clamp<int>(local_14,100,0xffff);
  NumParticles = (WORD)iVar2;
  P_DeinitParticles();
  uVar3 = CONCAT62(0,NumParticles);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(0x80),0);
  if (SUB168(auVar1 * ZEXT816(0x80),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  ppVar5 = (particle_t *)operator_new__(uVar4);
  if (uVar3 != 0) {
    local_48 = ppVar5;
    do {
      particle_t::particle_t(local_48);
      local_48 = local_48 + 1;
    } while (local_48 != ppVar5 + uVar3);
  }
  Particles = ppVar5;
  P_ClearParticles();
  addterm(P_DeinitParticles,"P_DeinitParticles");
  return;
}

Assistant:

void P_InitParticles ()
{
	const char *i;
	int num;

	if ((i = Args->CheckValue ("-numparticles")))
		num = atoi (i);
	// [BC] Use r_maxparticles now.
	else
		num = r_maxparticles;

	// This should be good, but eh...
	NumParticles = (WORD)clamp<int>(num, 100, 65535);

	P_DeinitParticles();
	Particles = new particle_t[NumParticles];
	P_ClearParticles ();
	atterm (P_DeinitParticles);
}